

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall google::protobuf::io::ArrayOutputStream::BackUp(ArrayOutputStream *this,int count)

{
  string *psVar1;
  LogMessage local_20 [16];
  
  if (this->last_returned_size_ < count) {
    psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)count,(long)this->last_returned_size_,"count <= last_returned_size_");
  }
  else {
    psVar1 = (string *)0x0;
  }
  if (psVar1 == (string *)0x0) {
    if (count < 0) {
      psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)count,0,"count >= 0");
    }
    else {
      psVar1 = (string *)0x0;
    }
    if (psVar1 == (string *)0x0) {
      this->position_ = this->position_ - count;
      this->last_returned_size_ = this->last_returned_size_ - count;
      return;
    }
    BackUp();
  }
  else {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x6d,*(undefined8 *)(psVar1 + 8),*(undefined8 *)psVar1);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (local_20,(char (*) [58])"BackUp() can not exceed the size of the last Next() call.");
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20);
}

Assistant:

void ArrayOutputStream::BackUp(int count) {
  ABSL_CHECK_LE(count, last_returned_size_)
      << "BackUp() can not exceed the size of the last Next() call.";
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ -= count;
}